

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O0

size_t __thiscall
ADynamicLight::PointerSubstitution(ADynamicLight *this,DObject *old,DObject *notOld)

{
  AActor *q;
  size_t sVar1;
  size_t ret;
  AActor *saved_target;
  DObject *notOld_local;
  DObject *old_local;
  ADynamicLight *this_local;
  
  q = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&(this->super_AActor).target);
  sVar1 = DObject::PointerSubstitution((DObject *)this,old,notOld);
  if (notOld != (DObject *)0x0) {
    TObjPtr<AActor>::operator=(&(this->super_AActor).target,q);
  }
  return sVar1;
}

Assistant:

size_t ADynamicLight::PointerSubstitution (DObject *old, DObject *notOld)
{
	AActor *saved_target = target;
	size_t ret = Super::PointerSubstitution(old, notOld);
	if (notOld != NULL) target = saved_target;
	return ret;
}